

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

Cbs2_Man_t * Cbs2_ManAlloc(Gia_Man_t *pGia)

{
  uint uVar1;
  ulong uVar2;
  Cbs2_Man_t *pCVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  
  pCVar3 = (Cbs2_Man_t *)calloc(1,400);
  (pCVar3->pClauses).nSize = 10000;
  (pCVar3->pJust).nSize = 10000;
  (pCVar3->pProp).nSize = 10000;
  piVar4 = (int *)malloc(40000);
  (pCVar3->pProp).pData = piVar4;
  piVar4 = (int *)malloc(40000);
  (pCVar3->pJust).pData = piVar4;
  piVar4 = (int *)malloc(40000);
  (pCVar3->pClauses).pData = piVar4;
  (pCVar3->pClauses).iHead = 1;
  (pCVar3->pClauses).iTail = 1;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar5->pArray = piVar4;
  pCVar3->vModel = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar5->pArray = piVar4;
  pCVar3->vTemp = pVVar5;
  pCVar3->pAig = pGia;
  (pCVar3->Pars).nBTLimit = 1000;
  (pCVar3->Pars).nJustLimit = 500;
  (pCVar3->Pars).fUseHighest = 1;
  (pCVar3->Pars).fUseFanout = 1;
  (pCVar3->Pars).fVerbose = 1;
  iVar9 = pGia->nObjs;
  if ((long)iVar9 < 1) {
    (pCVar3->vAssign).nSize = iVar9;
    iVar10 = 0;
  }
  else {
    pcVar6 = (char *)malloc((long)iVar9);
    (pCVar3->vAssign).pArray = pcVar6;
    (pCVar3->vAssign).nCap = iVar9;
    (pCVar3->vAssign).nSize = iVar9;
    lVar7 = 0;
    do {
      (pCVar3->vAssign).pArray[lVar7] = '\x02';
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pCVar3->vAssign).nSize);
    iVar9 = pGia->nObjs;
    iVar10 = (pCVar3->vMark).nCap;
  }
  if (iVar10 < iVar9) {
    pcVar6 = (pCVar3->vMark).pArray;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)malloc((long)iVar9);
    }
    else {
      pcVar6 = (char *)realloc(pcVar6,(long)iVar9);
    }
    (pCVar3->vMark).pArray = pcVar6;
    (pCVar3->vMark).nCap = iVar9;
  }
  (pCVar3->vMark).nSize = iVar9;
  if (0 < iVar9) {
    lVar7 = 0;
    do {
      (pCVar3->vMark).pArray[lVar7] = '\0';
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pCVar3->vMark).nSize);
  }
  iVar9 = pGia->nObjs;
  uVar2 = (long)iVar9 * 3;
  iVar10 = (int)uVar2;
  if ((pCVar3->vLevReason).nCap < iVar10) {
    piVar4 = (pCVar3->vLevReason).pArray;
    sVar8 = (long)iVar9 * 0xc;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar8);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar8);
    }
    (pCVar3->vLevReason).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vLevReason).nCap = iVar10;
  }
  if (0 < iVar9) {
    memset((pCVar3->vLevReason).pArray,0xff,(uVar2 & 0xffffffff) << 2);
  }
  (pCVar3->vLevReason).nSize = iVar10;
  iVar9 = pGia->nObjs;
  uVar2 = (long)iVar9 * 2;
  iVar10 = (int)uVar2;
  if ((pCVar3->vWatches).nCap < iVar10) {
    piVar4 = (pCVar3->vWatches).pArray;
    sVar8 = (long)iVar9 << 3;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar8);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar8);
    }
    (pCVar3->vWatches).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vWatches).nCap = iVar10;
  }
  if (0 < iVar9) {
    memset((pCVar3->vWatches).pArray,0,(uVar2 & 0xffffffff) << 2);
  }
  (pCVar3->vWatches).nSize = iVar10;
  uVar1 = pGia->nObjs;
  if ((pCVar3->vFanout0).nCap < (int)uVar1) {
    piVar4 = (pCVar3->vFanout0).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (pCVar3->vFanout0).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vFanout0).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pCVar3->vFanout0).pArray,0,(ulong)uVar1 * 4);
  }
  (pCVar3->vFanout0).nSize = uVar1;
  iVar9 = pGia->nObjs;
  uVar2 = (long)iVar9 * 2;
  iVar10 = (int)uVar2;
  if ((pCVar3->vFanoutN).nCap < iVar10) {
    piVar4 = (pCVar3->vFanoutN).pArray;
    sVar8 = (long)iVar9 << 3;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar8);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar8);
    }
    (pCVar3->vFanoutN).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vFanoutN).nCap = iVar10;
  }
  if (0 < iVar9) {
    memset((pCVar3->vFanoutN).pArray,0,(uVar2 & 0xffffffff) << 2);
  }
  (pCVar3->vFanoutN).nSize = iVar10;
  uVar1 = pGia->nObjs;
  if ((pCVar3->vActivity).nCap < (int)uVar1) {
    piVar4 = (pCVar3->vActivity).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (pCVar3->vActivity).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vActivity).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pCVar3->vActivity).pArray,0,(ulong)uVar1 * 4);
  }
  (pCVar3->vActivity).nSize = uVar1;
  if ((pCVar3->vActStore).nCap < 1000) {
    piVar4 = (pCVar3->vActStore).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(4000);
    }
    else {
      piVar4 = (int *)realloc(piVar4,4000);
    }
    (pCVar3->vActStore).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vActStore).nCap = 1000;
  }
  if ((pCVar3->vJStore).nCap < 1000) {
    piVar4 = (pCVar3->vJStore).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(4000);
    }
    else {
      piVar4 = (int *)realloc(piVar4,4000);
    }
    (pCVar3->vJStore).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00724bce;
    (pCVar3->vJStore).nCap = 1000;
  }
  if ((pCVar3->vWatchUpds).nCap < 1000) {
    piVar4 = (pCVar3->vWatchUpds).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(4000);
    }
    else {
      piVar4 = (int *)realloc(piVar4,4000);
    }
    (pCVar3->vWatchUpds).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_00724bce:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pCVar3->vWatchUpds).nCap = 1000;
  }
  return pCVar3;
}

Assistant:

Cbs2_Man_t * Cbs2_ManAlloc( Gia_Man_t * pGia )
{
    Cbs2_Man_t * p;
    p = ABC_CALLOC( Cbs2_Man_t, 1 );
    p->pProp.nSize = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData = ABC_ALLOC( int, p->pProp.nSize );
    p->pJust.pData = ABC_ALLOC( int, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( int, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel   = Vec_IntAlloc( 1000 );
    p->vTemp    = Vec_IntAlloc( 1000 );
    p->pAig     = pGia;
    Cbs2_SetDefaultParams( &p->Pars );
    Vec_StrFill( &p->vAssign,    Gia_ManObjNum(pGia), 2 );
    Vec_StrFill( &p->vMark,      Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vLevReason, 3*Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vWatches,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vFanout0,   Gia_ManObjNum(pGia),   0 );
    Vec_IntFill( &p->vFanoutN,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vActivity,  Gia_ManObjNum(pGia), 0 );
    Vec_IntGrow( &p->vActStore,  1000 );
    Vec_IntGrow( &p->vJStore,    1000 );
    Vec_IntGrow( &p->vWatchUpds, 1000 );
    return p;
}